

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::set_config(raft_server *this,ptr<cluster_config> *new_config)

{
  std::mutex::lock(&this->config_lock_);
  std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->stale_config_).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
             &(this->config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
             ,&new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->config_lock_);
  return;
}

Assistant:

void raft_server::set_config(const ptr<cluster_config>& new_config) {
    std::lock_guard<std::mutex> l(config_lock_);
    stale_config_ = config_;
    config_ = new_config;
}